

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O3

void __thiscall leveldb::WriteBatch::WriteBatch(WriteBatch *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->rep_)._M_dataplus._M_p = (pointer)&(this->rep_).field_2;
  (this->rep_)._M_string_length = 0;
  (this->rep_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (&this->rep_,0xc,'\0');
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

WriteBatch::WriteBatch() { Clear(); }